

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O2

string * __thiscall
sentencepiece::normalizer::Normalizer::EncodePrecompiledCharsMap_abi_cxx11_
          (string *__return_storage_ptr__,Normalizer *this,string_view trie_blob,
          string_view normalized)

{
  uint local_4c;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_4c = (uint)this;
  string_util::EncodePOD<unsigned_int>(&local_48,&local_4c);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((char *)__return_storage_ptr__,trie_blob._M_len);
  std::__cxx11::string::append((char *)__return_storage_ptr__,normalized._M_len);
  return __return_storage_ptr__;
}

Assistant:

std::string Normalizer::EncodePrecompiledCharsMap(
    absl::string_view trie_blob, absl::string_view normalized) {
  // <trie size(4byte)><double array trie><normalized string>
  std::string blob;
  blob.append(string_util::EncodePOD<uint32_t>(trie_blob.size()));
  blob.append(trie_blob.data(), trie_blob.size());

#ifdef IS_BIG_ENDIAN
  uint32_t *data = reinterpret_cast<uint32_t *>(blob.data());
  for (int i = 0; i < blob.size() / 4; ++i) data[i] = util::Swap32(data[i]);
#endif

  blob.append(normalized.data(), normalized.size());

  return blob;
}